

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooPHF.h
# Opt level: O0

void * boomphf::
       thread_processLevel<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>,std::vector<unsigned_long,std::allocator<unsigned_long>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                 (void *args)

{
  long *in_RDI;
  shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *unaff_retaddr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *in_stack_00000010;
  shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  until_p;
  shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  startit;
  pthread_mutex_t *mutex;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buffer;
  int level;
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *obw;
  thread_args<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *targ;
  shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *psVar1;
  shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this;
  shared_ptr<void> *in_stack_ffffffffffffff48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  size_type in_stack_ffffffffffffff58;
  undefined1 local_88 [32];
  shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_68;
  pthread_mutex_t *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  undefined4 local_24;
  long local_20;
  int i;
  shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *in_stack_fffffffffffffff8;
  void *pvVar3;
  
  if (in_RDI == (long *)0x0) {
    pvVar3 = (void *)0x0;
  }
  else {
    local_20 = *in_RDI;
    local_24 = (undefined4)in_RDI[6];
    pvVar2 = &local_40;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1186c2);
    i = (int)((ulong)in_RDI >> 0x20);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (pvVar2,in_stack_ffffffffffffff58);
    local_58 = (pthread_mutex_t *)(local_20 + 0x268);
    pthread_mutex_lock(local_58);
    psVar1 = &local_68;
    std::
    static_pointer_cast<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              (in_stack_ffffffffffffff48);
    this = (shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)(local_88 + 0x10);
    std::
    static_pointer_cast<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              (in_stack_ffffffffffffff48);
    pthread_mutex_unlock(local_58);
    pvVar2 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_88;
    std::
    shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::shared_ptr(this,psVar1);
    std::
    shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::shared_ptr(this,psVar1);
    mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
    pthread_processLevel<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,i);
    std::
    shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~shared_ptr((shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)0x118793);
    std::
    shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~shared_ptr((shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)0x11879d);
    pvVar3 = (void *)0x0;
    std::
    shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~shared_ptr((shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)0x1187b3);
    std::
    shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::~shared_ptr((shared_ptr<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   *)0x1187bd);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(pvVar2);
  }
  return pvVar3;
}

Assistant:

void * thread_processLevel(void * args)
	{
		if(args ==NULL) return NULL;

		thread_args<Range,it_type> *targ = (thread_args<Range,it_type>*) args;

		mphf<elem_t, Hasher_t>  * obw = (mphf<elem_t, Hasher_t > *) targ->boophf;
		int level = targ->level;
		std::vector<elem_t> buffer;
		buffer.resize(NBBUFF);
		
		pthread_mutex_t * mutex =  & obw->_mutex;

		pthread_mutex_lock(mutex); // from comment above: "//get starting iterator for this thread, must be protected (must not be currently used by other thread to copy elems in buff)"
        std::shared_ptr<it_type> startit = std::static_pointer_cast<it_type>(targ->it_p);
        std::shared_ptr<it_type> until_p = std::static_pointer_cast<it_type>(targ->until_p);
		pthread_mutex_unlock(mutex);

		obw->pthread_processLevel(buffer, startit, until_p, level);

		return NULL;
	}